

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::CopyTexImage2D::CopyTexImage2D
          (CopyTexImage2D *this,SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture,GLint level,
          GLint internalFormat,GLint x,GLint y,GLsizei width,GLsizei height,GLint border,
          bool useSync,bool serverSync)

{
  Texture *pTVar1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_60;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *local_50;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> local_48;
  
  Operation::Operation(&this->super_Operation,"CopyTexImage2D",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__CopyTexImage2D_003d5ed0;
  local_50 = &this->m_texture;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr(local_50,texture);
  this->m_level = level;
  this->m_internalFormat = internalFormat;
  this->m_x = x;
  this->m_y = y;
  this->m_width = width;
  this->m_height = height;
  this->m_border = border;
  local_60.m_ptr = &((this->m_texture).m_ptr)->super_Object;
  local_60.m_state = (this->m_texture).m_state;
  if (local_60.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_60.m_state)->strongRefCount = (local_60.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_60.m_state)->weakRefCount = (local_60.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::modifyGLObject(&this->super_Operation,&local_60);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::release(&local_60);
  pTVar1 = texture->m_ptr;
  pTVar1->isDefined = true;
  local_48.m_ptr = (EGLImage *)0x0;
  local_48.m_state = (SharedPtrStateBase *)0x0;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::operator=(&pTVar1->sourceImage,&local_48);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::release(&local_48);
  return;
}

Assistant:

CopyTexImage2D::CopyTexImage2D (SharedPtr<Texture> texture, GLint level, GLint internalFormat, GLint x, GLint y, GLsizei width, GLsizei height, GLint border, bool useSync, bool serverSync)
	: Operation			("CopyTexImage2D", useSync, serverSync)
	, m_texture			(texture)
	, m_level			(level)
	, m_internalFormat	(internalFormat)
	, m_x				(x)
	, m_y				(y)
	, m_width			(width)
	, m_height			(height)
	, m_border			(border)
{
	modifyGLObject(SharedPtr<Object>(m_texture));
	texture->isDefined = true;

	// Orphang texture
	texture->sourceImage = SharedPtr<EGLImage>();
}